

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::Yolov3DetectionOutput_x86_avx512::forward
          (Yolov3DetectionOutput_x86_avx512 *this,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float *pfVar1;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
  *this_00;
  undefined4 uVar2;
  size_t sVar3;
  void *pvVar4;
  iterator __position;
  Mat *this_01;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  undefined1 auVar12 [16];
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar13;
  int iVar14;
  int iVar15;
  undefined8 uVar16;
  undefined4 *puVar17;
  float *pfVar18;
  ulong uVar19;
  BBoxRect *__args;
  int iVar20;
  long lVar21;
  float *pfVar22;
  int iVar23;
  pointer pMVar24;
  long in_R9;
  uint _h;
  long lVar25;
  float *pfVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  float fVar31;
  float fVar32;
  undefined4 extraout_XMM0_Db;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 extraout_var [60];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [64];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined8 uVar47;
  undefined1 auVar48 [64];
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  bbox_rects;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  all_bbox_rects;
  vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  local_1c8;
  ulong local_1a8;
  long local_1a0;
  BBoxRect local_198;
  Yolov3DetectionOutput *local_170;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  local_168;
  undefined1 local_148 [16];
  ulong local_138;
  uint *local_130;
  float *local_128;
  float *local_120;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_118;
  Option *local_110;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_108;
  pointer local_100;
  long local_f8;
  long local_f0;
  void *local_e8;
  ulong local_e0;
  float *local_d8;
  long local_d0;
  undefined8 local_c8;
  void *local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [8];
  float fStack_a0;
  float fStack_9c;
  undefined1 local_98 [8];
  float fStack_90;
  float fStack_8c;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  float local_68;
  undefined4 uStack_64;
  undefined1 local_58 [32];
  undefined1 auVar40 [16];
  
  local_168.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118 = top_blobs;
  local_110 = opt;
  if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    local_1a8 = 0;
    local_170 = &this->super_Yolov3DetectionOutput;
    local_108 = bottom_blobs;
    do {
      pvVar13 = local_108;
      local_1c8.
      super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1c8.
      super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1c8.
      super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ::resize(&local_1c8,(long)(this->super_Yolov3DetectionOutput).num_box);
      pMVar24 = (pvVar13->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      iVar23 = (this->super_Yolov3DetectionOutput).num_box;
      iVar14 = pMVar24[local_1a8].c / iVar23;
      if (iVar14 != (this->super_Yolov3DetectionOutput).num_class + 5) {
        std::
        vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
        ::~vector(&local_1c8);
        iVar23 = -1;
        goto LAB_004491a4;
      }
      if (0 < iVar23) {
        pMVar24 = pMVar24 + local_1a8;
        uVar19._0_4_ = pMVar24->w;
        uVar19._4_4_ = pMVar24->h;
        auVar29._8_8_ = 0;
        auVar29._0_8_ = uVar19;
        auVar29 = vcvtdq2ps_avx(auVar29);
        uVar2 = *(undefined4 *)
                 ((long)(this->super_Yolov3DetectionOutput).anchors_scale.data + local_1a8 * 4);
        auVar27._4_4_ = uVar2;
        auVar27._0_4_ = uVar2;
        auVar27._8_4_ = uVar2;
        auVar27._12_4_ = uVar2;
        auVar27 = vmulps_avx512vl(auVar29,auVar27);
        local_138 = uVar19 >> 0x20;
        in_R9 = CONCAT44((int)((ulong)in_R9 >> 0x20),(undefined4)uVar19);
        local_b8 = vroundps_avx(auVar27,0xb);
        local_f8 = (long)iVar14;
        auVar28._0_12_ = ZEXT412(0x3f000000) << 0x40;
        auVar28._12_4_ = 0x3f000000;
        local_98 = auVar29._0_8_;
        register0x00001248 = auVar28._8_8_;
        auVar33._8_4_ = 0x3f800000;
        auVar33._0_8_ = 0x3f8000003f800000;
        auVar33._12_4_ = 0x3f800000;
        _local_a8 = vdivps_avx(auVar33,_local_98);
        local_f0 = (long)iVar23 * local_1a8 * 4;
        local_1a0 = 0;
        local_100 = pMVar24;
        local_d0 = in_R9;
        do {
          uVar19 = pMVar24->elemsize;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = uVar19;
          auVar6._8_8_ = 0;
          auVar6._0_8_ = (long)pMVar24->d * uVar19 * (long)pMVar24->h * (long)pMVar24->w + 0xf &
                         0xfffffffffffffff0;
          uVar16 = SUB168(auVar6 / auVar5,0);
          if (0 < (int)local_138) {
            lVar21 = local_1a0 * local_f8;
            sVar3 = pMVar24->cstep;
            pvVar4 = pMVar24->data;
            local_e8 = (void *)((lVar21 + 5) * sVar3 * uVar19 + (long)pvVar4);
            auVar34._8_8_ = 0;
            auVar34._0_8_ =
                 *(ulong *)((long)(this->super_Yolov3DetectionOutput).biases.data +
                           (long)((int)*(float *)((long)(this->super_Yolov3DetectionOutput).mask.
                                                        data + local_1a0 * 4 + local_f0) * 2) * 4);
            auVar28 = vpbroadcastd_avx512vl();
            auVar29 = vpmulld_avx(auVar28,_DAT_005a69e0);
            auVar27 = vpmulld_avx(auVar28,_DAT_005b0ac0);
            auVar30 = vpexpandd_avx512vl(ZEXT1632(auVar28));
            auVar7 = vpermq_avx2(ZEXT1632(auVar29),0xd0);
            auVar7 = vpblendd_avx2(auVar7,ZEXT432(auVar30._4_4_) << 0x20,3);
            uVar47 = auVar27._0_8_;
            auVar30._8_8_ = uVar47;
            auVar30._0_8_ = uVar47;
            auVar30._16_8_ = uVar47;
            auVar30._24_8_ = uVar47;
            local_58 = vpblendd_avx2(auVar7,auVar30,0xc0);
            pfVar26 = (float *)((lVar21 + 4) * sVar3 * uVar19 + (long)pvVar4);
            local_120 = (float *)((lVar21 + 3) * sVar3 * uVar19 + (long)pvVar4);
            local_128 = (float *)((lVar21 + 2) * sVar3 * uVar19 + (long)pvVar4);
            local_130 = (uint *)((lVar21 + 1) * sVar3 * uVar19 + (long)pvVar4);
            pfVar22 = (float *)(lVar21 * sVar3 * uVar19 + (long)pvVar4);
            iVar23 = SUB164(auVar6 / auVar5,0);
            auVar40._8_4_ = 0x3f800000;
            auVar40._0_8_ = 0x3f8000003f800000;
            auVar40._12_4_ = 0x3f800000;
            auVar43 = ZEXT1664(auVar40);
            local_88 = vmovlhps_avx(auVar40,auVar34);
            uVar19 = 0;
            local_c8 = uVar16;
            do {
              local_e0 = uVar19;
              if (0 < (int)in_R9) {
                auVar35._0_4_ = (float)(int)uVar19;
                local_c0 = (void *)((long)local_e8 + uVar19 * in_R9 * 4);
                auVar35._4_4_ = auVar35._0_4_;
                auVar35._8_4_ = auVar35._0_4_;
                auVar35._12_4_ = auVar35._0_4_;
                local_78 = vunpcklpd_avx(auVar35,local_b8);
                lVar21 = 0;
                do {
                  pfVar1 = (float *)((long)local_c0 + lVar21 * 4);
                  iVar14 = (local_170->num_class & 0xfffffff8U) * (int)uVar16;
                  pfVar18 = pfVar1;
                  if (iVar14 < 1) {
                    iVar15 = 0;
                    auVar48 = ZEXT464(0xff7fffff);
                    iVar20 = 0;
                  }
                  else {
                    iVar20 = 0;
                    auVar48 = ZEXT464(0xff7fffff);
                    iVar15 = 0;
                    do {
                      auVar7 = vpcmpeqd_avx2(auVar43._0_32_,auVar43._0_32_);
                      auVar39 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar7);
                      auVar7 = vpermpd_avx2(auVar39,0x4e);
                      auVar7 = vmaxps_avx(auVar39,auVar7);
                      auVar30 = vshufpd_avx(auVar7,auVar7,5);
                      auVar7 = vmaxps_avx(auVar7,auVar30);
                      auVar30 = vshufps_avx(auVar7,auVar7,0xb1);
                      auVar7 = vmaxps_avx(auVar7,auVar30);
                      auVar43 = ZEXT3264(auVar7);
                      if (auVar48._0_4_ < auVar7._0_4_) {
                        uVar47 = vcmpps_avx512vl(auVar39,auVar7,0);
                        iVar20 = 0;
                        if ((uint)uVar47 != 0) {
                          for (; ((uint)uVar47 >> iVar20 & 1) == 0; iVar20 = iVar20 + 1) {
                          }
                        }
                        iVar20 = iVar20 + iVar15;
                        auVar48 = ZEXT1664(auVar7._0_16_);
                      }
                      pfVar18 = pfVar18 + iVar23 * 8;
                      iVar15 = iVar15 + 8;
                    } while (pfVar18 < pfVar1 + iVar14);
                  }
                  for (; local_148 = auVar48._0_16_,
                      pfVar18 < pfVar1 + local_170->num_class * (int)uVar16;
                      pfVar18 = pfVar18 + iVar23) {
                    if (auVar48._0_4_ < *pfVar18) {
                      iVar20 = iVar15;
                    }
                    auVar29 = vmaxss_avx(ZEXT416((uint)*pfVar18),local_148);
                    auVar48 = ZEXT1664(auVar29);
                    iVar15 = iVar15 + 1;
                  }
                  fVar31 = expf(-*pfVar26);
                  auVar8._8_4_ = 0x80000000;
                  auVar8._0_8_ = 0x8000000080000000;
                  auVar8._12_4_ = 0x80000000;
                  auVar29 = vxorps_avx512vl(local_148,auVar8);
                  fVar32 = expf(auVar29._0_4_);
                  auVar43 = ZEXT464(0x3f800000);
                  auVar29 = vfmadd132ss_fma(ZEXT416((uint)(fVar32 + 1.0)),auVar43._0_16_,
                                            ZEXT416((uint)fVar31));
                  fVar31 = 1.0 / auVar29._0_4_;
                  if (local_170->confidence_threshold <= fVar31) {
                    local_d8 = pfVar26;
                    fVar32 = expf(-*pfVar22);
                    local_148 = ZEXT416((uint)(fVar32 + 1.0));
                    auVar9._8_4_ = 0x80000000;
                    auVar9._0_8_ = 0x8000000080000000;
                    auVar9._12_4_ = 0x80000000;
                    auVar29 = vxorps_avx512vl(ZEXT416(*local_130),auVar9);
                    fVar32 = expf(auVar29._0_4_);
                    local_148 = vinsertps_avx(local_148,ZEXT416((uint)(fVar32 + 1.0)),0x10);
                    local_68 = expf(*local_128);
                    uStack_64 = extraout_XMM0_Db;
                    auVar43._0_4_ = expf(*local_120);
                    auVar43._4_60_ = extraout_var;
                    auVar41._8_8_ = CONCAT44(uStack_64,local_68);
                    auVar41._0_8_ = CONCAT44(uStack_64,local_68);
                    auVar27 = vinsertps_avx(auVar41,auVar43._0_16_,0x30);
                    auVar29 = vdivps_avx(local_88,local_148);
                    auVar44._0_4_ = (float)(int)lVar21;
                    auVar44._4_12_ = local_78._4_12_;
                    auVar10._4_8_ = auVar27._8_8_;
                    auVar10._0_4_ = local_88._4_4_ * auVar27._4_4_;
                    auVar36._0_8_ = auVar10._0_8_ << 0x20;
                    auVar36._8_4_ = local_88._8_4_ * auVar27._8_4_;
                    auVar36._12_4_ = local_88._12_4_ * auVar27._12_4_;
                    auVar37._8_8_ = auVar36._8_8_;
                    auVar37._0_8_ = auVar29._0_8_;
                    auVar42._0_4_ = (auVar29._0_4_ + auVar44._0_4_) * (float)local_a8._0_4_;
                    auVar42._4_4_ = (auVar29._4_4_ + local_78._4_4_) * (float)local_a8._4_4_;
                    auVar42._8_4_ = (auVar29._8_4_ + local_78._8_4_) * fStack_a0;
                    auVar42._12_4_ = (auVar29._12_4_ + local_78._12_4_) * fStack_9c;
                    auVar29 = vdivps_avx(auVar37,auVar44);
                    auVar45._0_4_ = auVar29._0_4_ * (float)local_98._0_4_;
                    auVar45._4_4_ = auVar29._4_4_ * (float)local_98._4_4_;
                    auVar45._8_4_ = auVar29._8_4_ * fStack_90;
                    auVar45._12_4_ = auVar29._12_4_ * fStack_8c;
                    auVar27 = vshufpd_avx(auVar45,auVar42,1);
                    auVar28 = vsubps_avx(auVar42,auVar27);
                    auVar11._4_8_ = auVar45._8_8_;
                    auVar11._0_4_ = auVar45._4_4_ + auVar27._4_4_;
                    auVar46._0_8_ = auVar11._0_8_ << 0x20;
                    auVar46._8_4_ = auVar45._8_4_ + auVar27._8_4_;
                    auVar46._12_4_ = auVar45._12_4_ + auVar27._12_4_;
                    uVar16 = auVar46._8_8_;
                    auVar43 = ZEXT1664(CONCAT88(uVar16,auVar28._0_8_));
                    auVar27 = vmovshdup_avx(auVar29);
                    auVar38._0_4_ = auVar27._0_4_ * auVar29._0_4_;
                    auVar38._4_4_ = auVar27._4_4_ * auVar29._4_4_;
                    auVar38._8_4_ = auVar27._8_4_ * auVar29._8_4_;
                    auVar38._12_4_ = auVar27._12_4_ * auVar29._12_4_;
                    local_198.xmin = auVar28._0_4_;
                    local_198.ymin = auVar28._4_4_;
                    local_198.area = (float)vextractps_avx(auVar38,2);
                    this_00 = (vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                               *)(local_1c8.
                                  super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + local_1a0);
                    __position._M_current = *(BBoxRect **)(this_00 + 8);
                    local_198.score = fVar31;
                    local_198.xmax = auVar46._8_4_;
                    local_198.ymax = auVar46._12_4_;
                    local_198.label = iVar20;
                    if (__position._M_current == *(BBoxRect **)(this_00 + 0x10)) {
                      std::
                      vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                      ::_M_realloc_insert<ncnn::Yolov3DetectionOutput::BBoxRect_const&>
                                (this_00,__position,&local_198);
                      pfVar26 = local_d8;
                    }
                    else {
                      auVar12._8_4_ = local_198.area;
                      auVar12._0_8_ = uVar16;
                      auVar12._12_4_ = iVar20;
                      auVar43 = ZEXT1664(auVar12);
                      (__position._M_current)->xmax = (float)(int)uVar16;
                      (__position._M_current)->ymax = (float)(int)((ulong)uVar16 >> 0x20);
                      (__position._M_current)->area = local_198.area;
                      (__position._M_current)->label = iVar20;
                      (__position._M_current)->score = fVar31;
                      (__position._M_current)->xmin = local_198.xmin;
                      (__position._M_current)->ymin = local_198.ymin;
                      (__position._M_current)->xmax = auVar46._8_4_;
                      *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x1c;
                      pfVar26 = local_d8;
                    }
                  }
                  pfVar22 = pfVar22 + 1;
                  local_130 = local_130 + 1;
                  local_128 = local_128 + 1;
                  local_120 = local_120 + 1;
                  pfVar26 = pfVar26 + 1;
                  lVar21 = lVar21 + 1;
                  in_R9 = local_d0;
                  uVar16 = local_c8;
                } while (lVar21 != local_d0);
              }
              uVar19 = local_e0 + 1;
            } while (uVar19 != local_138);
            iVar23 = local_170->num_box;
            pMVar24 = local_100;
            this = (Yolov3DetectionOutput_x86_avx512 *)local_170;
          }
          local_1a0 = local_1a0 + 1;
        } while (local_1a0 < iVar23);
        if (0 < iVar23) {
          lVar21 = 8;
          lVar25 = 0;
          do {
            std::
            vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
            ::
            _M_range_insert<__gnu_cxx::__normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect_const*,std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>>>
                      ((vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                        *)&local_168,
                       local_168.
                       super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       *(undefined8 *)
                        ((long)local_1c8.
                               super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar21 + -8),
                       *(undefined8 *)
                        ((long)&((local_1c8.
                                  super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                )._M_impl.super__Vector_impl_data._M_start + lVar21));
            lVar25 = lVar25 + 1;
            lVar21 = lVar21 + 0x18;
          } while (lVar25 < (this->super_Yolov3DetectionOutput).num_box);
        }
      }
      std::
      vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ::~vector(&local_1c8);
      local_1a8 = local_1a8 + 1;
    } while (local_1a8 <
             (ulong)(((long)(local_108->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(local_108->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                            _M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7));
  }
  Yolov3DetectionOutput::qsort_descent_inplace(&this->super_Yolov3DetectionOutput,&local_168);
  local_198.score = 0.0;
  local_198.xmin = 0.0;
  local_198.ymin = 0.0;
  local_198.xmax = 0.0;
  local_198.ymax = 0.0;
  local_198.area = 0.0;
  Yolov3DetectionOutput::nms_sorted_bboxes
            (&this->super_Yolov3DetectionOutput,&local_168,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_198,
             (this->super_Yolov3DetectionOutput).nms_threshold);
  local_1c8.
  super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar21 = CONCAT44(local_198.xmin,local_198.score);
  lVar25 = CONCAT44(local_198.xmax,local_198.ymin);
  if (lVar25 == lVar21) {
    iVar23 = 0;
  }
  else {
    uVar19 = 0;
    do {
      __args = local_168.
               super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
               ._M_impl.super__Vector_impl_data._M_start + *(long *)(lVar21 + uVar19 * 8);
      if (local_1c8.
          super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_1c8.
          super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
        ::_M_realloc_insert<ncnn::Yolov3DetectionOutput::BBoxRect_const&>
                  ((vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                    *)&local_1c8,
                   (iterator)
                   local_1c8.
                   super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,__args);
        lVar21 = CONCAT44(local_198.xmin,local_198.score);
        lVar25 = CONCAT44(local_198.xmax,local_198.ymin);
      }
      else {
        uVar16 = *(undefined8 *)__args;
        uVar47 = *(undefined8 *)&__args->ymin;
        *(undefined1 (*) [16])
         ((long)local_1c8.
                super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + 0xc) =
             *(undefined1 (*) [16])&__args->xmax;
        *(undefined8 *)
         local_1c8.
         super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish = uVar16;
        *(undefined8 *)
         ((long)local_1c8.
                super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + 8) = uVar47;
        local_1c8.
        super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)((long)local_1c8.
                             super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 0x1c);
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 < (ulong)(lVar25 - lVar21 >> 3));
    _h = (int)((long)local_1c8.
                     super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_1c8.
                     super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x49249249;
    iVar23 = 0;
    if (_h != 0) {
      this_01 = (local_118->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      Mat::create(this_01,6,_h,4,local_110->blob_allocator);
      iVar23 = -100;
      if (((this_01->data != (void *)0x0) && ((long)this_01->c * this_01->cstep != 0)) &&
         (iVar23 = 0, 0 < (int)_h)) {
        iVar14 = this_01->w;
        sVar3 = this_01->elemsize;
        puVar17 = (undefined4 *)((long)this_01->data + 0x14);
        iVar23 = 0;
        lVar21 = 0;
        do {
          uVar2 = *(undefined4 *)
                   ((long)&((local_1c8.
                             super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                           )._M_impl.super__Vector_impl_data._M_start + lVar21);
          puVar17[-5] = (float)*(int *)((long)&local_1c8.
                                               super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start[1].
                                               super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                               ._M_impl.super__Vector_impl_data._M_start + lVar21) +
                        1.0;
          puVar17[-4] = uVar2;
          puVar17[-3] = *(undefined4 *)
                         ((long)&((local_1c8.
                                   super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                 )._M_impl.super__Vector_impl_data._M_start + lVar21 + 4);
          puVar17[-2] = *(undefined4 *)
                         ((long)&((local_1c8.
                                   super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                 )._M_impl.super__Vector_impl_data._M_finish + lVar21);
          puVar17[-1] = *(undefined4 *)
                         ((long)&((local_1c8.
                                   super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                 )._M_impl.super__Vector_impl_data._M_finish + lVar21 + 4);
          *puVar17 = *(undefined4 *)
                      ((long)&((local_1c8.
                                super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                              )._M_impl.super__Vector_impl_data._M_end_of_storage + lVar21);
          lVar21 = lVar21 + 0x1c;
          puVar17 = (undefined4 *)((long)puVar17 + (long)iVar14 * sVar3);
        } while ((ulong)(_h & 0x7fffffff) * 0x1c != lVar21);
      }
    }
  }
  if (local_1c8.
      super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c8.
                    super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1c8.
                          super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.
                          super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pvVar4 = (void *)CONCAT44(local_198.xmin,local_198.score);
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,CONCAT44(local_198.area,local_198.ymax) - (long)pvVar4);
  }
LAB_004491a4:
  if (local_168.
      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168.
                    super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_168.
                          super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.
                          super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return iVar23;
}

Assistant:

int Yolov3DetectionOutput_x86_avx512::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    // gather all box
    std::vector<BBoxRect> all_bbox_rects;

    for (size_t b = 0; b < bottom_blobs.size(); b++)
    {
        std::vector<std::vector<BBoxRect> > all_box_bbox_rects;
        all_box_bbox_rects.resize(num_box);
        const Mat& bottom_top_blobs = bottom_blobs[b];

        int w = bottom_top_blobs.w;
        int h = bottom_top_blobs.h;
        int channels = bottom_top_blobs.c;
        //printf("%d %d %d\n", w, h, channels);
        const int channels_per_box = channels / num_box;

        // anchor coord + box score + num_class
        if (channels_per_box != 4 + 1 + num_class)
            return -1;
        size_t mask_offset = b * num_box;
        int net_w = (int)(anchors_scale[b] * w);
        int net_h = (int)(anchors_scale[b] * h);
//printf("%d %d\n", net_w, net_h);

//printf("%d %d %d\n", w, h, channels);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < num_box; pp++)
        {
            int p = pp * channels_per_box;
            int biases_index = static_cast<int>(mask[pp + mask_offset]);
            //printf("%d\n", biases_index);
            const float bias_w = biases[biases_index * 2];
            const float bias_h = biases[biases_index * 2 + 1];
            //printf("%f %f\n", bias_w, bias_h);
            const float* xptr = bottom_top_blobs.channel(p);
            const float* yptr = bottom_top_blobs.channel(p + 1);
            const float* wptr = bottom_top_blobs.channel(p + 2);
            const float* hptr = bottom_top_blobs.channel(p + 3);

            const float* box_score_ptr = bottom_top_blobs.channel(p + 4);

            // softmax class scores
            Mat scores = bottom_top_blobs.channel_range(p + 5, num_class);
            //softmax->forward_inplace(scores, opt);

            const int cs = (int)scores.cstep;

#if __AVX2__
            const __m256i vi = _mm256_setr_epi32(
                                   0, cs * 1, cs * 2, cs * 3, cs * 4, cs * 5, cs * 6, cs * 7);
#endif

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
#if 0
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    for (int q = 0; q < num_class; q++)
                    {
                        float score = scores.channel(q).row(i)[j];
                        if (score > class_score)
                        {
                            class_index = q;
                            class_score = score;
                        }
                    }
#else
                    // find class index with max class score
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    float* ptr = ((float*)scores.data) + i * w + j;
                    float* end = ptr + num_class * cs;
                    int q = 0;
#if __AVX2__
                    float* end8 = ptr + (num_class & -8) * cs;
                    unsigned long index;

                    for (; ptr < end8; ptr += 8 * cs, q += 8)
                    {
                        __m256 p = _mm256_i32gather_ps(ptr, vi, 4);
                        __m256 t = _mm256_max_ps(p, _mm256_permute2f128_ps(p, p, 1));
                        t = _mm256_max_ps(t, _mm256_permute_ps(t, 0x4e));
                        t = _mm256_max_ps(t, _mm256_permute_ps(t, 0xb1));
                        float score = _mm_cvtss_f32(_mm256_extractf128_ps(t, 0));

                        if (score > class_score)
                        {
                            __m256 mi = _mm256_cmp_ps(p, t, _CMP_EQ_OQ);
                            int mask = _mm256_movemask_ps(mi);
#ifdef _MSC_VER
                            BitScanForward(&index, mask);
#else
                            index = __builtin_ctz(mask);
#endif
                            class_index = q + index;
                            class_score = score;
                        }
                    }
#endif

                    for (; ptr < end; ptr += cs, q++)
                    {
                        if (*ptr > class_score)
                        {
                            class_index = q;
                            class_score = *ptr;
                        }
                    }
#endif
                    //sigmoid(box_score) * sigmoid(class_score)
                    float confidence = 1.f / ((1.f + expf(-box_score_ptr[0]) * (1.f + expf(-class_score))));
                    if (confidence >= confidence_threshold)
                    {
                        // region box
                        float bbox_cx = (j + sigmoid(xptr[0])) / w;
                        float bbox_cy = (i + sigmoid(yptr[0])) / h;
                        float bbox_w = expf(wptr[0]) * bias_w / net_w;
                        float bbox_h = expf(hptr[0]) * bias_h / net_h;

                        float bbox_xmin = bbox_cx - bbox_w * 0.5f;
                        float bbox_ymin = bbox_cy - bbox_h * 0.5f;
                        float bbox_xmax = bbox_cx + bbox_w * 0.5f;
                        float bbox_ymax = bbox_cy + bbox_h * 0.5f;

                        float area = bbox_w * bbox_h;

                        BBoxRect c = {confidence, bbox_xmin, bbox_ymin, bbox_xmax, bbox_ymax, area, class_index};
                        all_box_bbox_rects[pp].push_back(c);
                    }

                    xptr++;
                    yptr++;
                    wptr++;
                    hptr++;

                    box_score_ptr++;
                }
            }
        }

        for (int i = 0; i < num_box; i++)
        {
            const std::vector<BBoxRect>& box_bbox_rects = all_box_bbox_rects[i];

            all_bbox_rects.insert(all_bbox_rects.end(), box_bbox_rects.begin(), box_bbox_rects.end());
        }
    }

    // global sort inplace
    qsort_descent_inplace(all_bbox_rects);

    // apply nms
    std::vector<size_t> picked;
    nms_sorted_bboxes(all_bbox_rects, picked, nms_threshold);

    // select
    std::vector<BBoxRect> bbox_rects;

    for (size_t i = 0; i < picked.size(); i++)
    {
        size_t z = picked[i];
        bbox_rects.push_back(all_bbox_rects[z]);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = r.score;
        float* outptr = top_blob.row(i);

        outptr[0] = r.label + 1.0f; // +1 for prepend background class
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}